

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::init
          (TransformFeedbackCase *this,EVP_PKEY_CTX *ctx)

{
  ProgramSpec *this_00;
  vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  *this_01;
  pointer pbVar1;
  RenderContext *renderCtx;
  pointer this_02;
  VarType *pVVar2;
  TransformFeedback *this_03;
  pointer pOVar3;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var4;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Varying_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>_>
  _Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  DataType dataType;
  int iVar10;
  deUint32 dVar11;
  int extraout_EAX;
  int iVar12;
  undefined4 extraout_var;
  ostream *poVar14;
  string *name_;
  pointer pVVar15;
  ShaderProgram *pSVar16;
  ProgramSources *pPVar17;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var18;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Varying_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>_>
  _Var19;
  TypedObjectWrapper<(glu::ObjectType)4> *this_04;
  NotSupportedError *this_05;
  pointer path;
  TypeComponentVector *pTVar20;
  uint *puVar21;
  TransformFeedbackCase *path_00;
  TypeComponentVector *path_01;
  char *nameWithPath;
  size_t __n;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *nameWithPath_00;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  pointer pOVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  char *pcVar24;
  pointer_____offset_0x10___ *ppuVar25;
  VectorTypeIterator *this_06;
  ostringstream *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  char *pcVar27;
  string attribName;
  VectorTypeIterator vecIter;
  string fragSource;
  VectorTypeIterator vecIter_1;
  VarType subType;
  Attribute *attrib;
  VarType attribType;
  string vertSource;
  int maxTfInterleavedComponents;
  _Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> local_340;
  ostringstream vtx;
  undefined4 uStack_324;
  undefined1 auStack_320 [168];
  pointer local_278;
  undefined1 uStack_270;
  undefined7 uStack_26f;
  undefined1 uStack_268;
  undefined8 uStack_267;
  ostringstream frag;
  undefined1 auStack_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_190 [22];
  long lVar13;
  
  pbVar1 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar8);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  dVar11 = this->m_bufferMode;
  dVar9 = this->m_primitiveType;
  vertSource._M_dataplus._M_p = (pointer)&vertSource.field_2;
  vertSource._M_string_length = 0;
  vertSource.field_2._M_local_buf[0] = '\0';
  fragSource._M_dataplus._M_p = (pointer)&fragSource.field_2;
  fragSource._M_string_length = 0;
  fragSource.field_2._M_allocated_capacity =
       fragSource.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  this_00 = &this->m_progSpec;
  bVar6 = ProgramSpec::isPointSizeUsed(this_00);
  poVar14 = std::operator<<((ostream *)&vtx,"#version 300 es\n");
  std::operator<<(poVar14,"in highp vec4 a_position;\n");
  poVar14 = std::operator<<((ostream *)&frag,"#version 300 es\n");
  poVar14 = std::operator<<(poVar14,"layout(location = 0) out mediump vec4 o_color;\n");
  poVar14 = std::operator<<(poVar14,"uniform highp vec4 u_scale;\n");
  std::operator<<(poVar14,"uniform highp vec4 u_bias;\n");
  if (bVar6) {
    std::operator<<((ostream *)&vtx,"in highp float a_pointSize;\n");
  }
  name_ = (string *)&subType;
  for (pVVar15 = (this->m_progSpec).m_varyings.
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar15 !=
      (this->m_progSpec).m_varyings.
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
      ._M_impl.super__Vector_impl_data._M_finish; pVVar15 = pVVar15 + 1) {
    this_02 = (((_Vector_impl *)&(pVVar15->name)._M_dataplus)->super__Vector_impl_data)._M_start;
    path = pVVar15;
    glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator(&vecIter,&pVVar15->type);
    while( true ) {
      vecIter_1.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecIter_1.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecIter_1.m_type = (VarType *)0x0;
      vecIter_1.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bVar7 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                        (&vecIter,(SubTypeIterator<glu::IsVectorOrScalarType> *)&vecIter_1);
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base(&vecIter_1.m_path.
                     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                   );
      if (!bVar7) break;
      glu::getVarType(&attribType,&pVVar15->type,&vecIter.m_path);
      getAttributeName_abi_cxx11_
                (&attribName,(TransformFeedback *)this_02,(char *)&vecIter.m_path,
                 (TypeComponentVector *)path);
      poVar14 = std::operator<<((ostream *)&vtx,"in ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)name_,attribName._M_dataplus._M_p,(allocator<char> *)&attrib);
      path = (pointer)0x0;
      glu::decl::DeclareVariable::DeclareVariable((DeclareVariable *)&vecIter_1,&attribType,name_,0)
      ;
      poVar14 = glu::decl::operator<<(poVar14,(DeclareVariable *)&vecIter_1);
      std::operator<<(poVar14,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&vecIter_1);
      std::__cxx11::string::~string((string *)name_);
      std::__cxx11::string::~string((string *)&attribName);
      glu::VarType::~VarType(&attribType);
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)&maxTfInterleavedComponents,&vecIter,
                 0);
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base(&local_340);
    }
    std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::~_Vector_base
              (&vecIter.m_path.
                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>);
  }
  for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
    pcVar27 = "in";
    if (iVar8 == 0) {
      pcVar27 = "out";
    }
    str = &frag;
    if (iVar8 == 0) {
      str = &vtx;
    }
    for (name_ = (string *)
                 (this_00->m_structs).
                 super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        name_ != (string *)
                 (this->m_progSpec).m_structs.
                 super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                 super__Vector_impl_data._M_finish; name_ = (string *)&name_->_M_string_length) {
      pVVar2 = (VarType *)(name_->_M_dataplus)._M_p;
      if ((pVVar2->m_data).array.elementType != (VarType *)0x0) {
        vecIter_1.m_path.
        super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)vecIter_1.m_path.
                              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        vecIter_1.m_type = pVVar2;
        poVar14 = glu::decl::operator<<((ostream *)str,(DeclareStructTypePtr *)&vecIter_1);
        std::operator<<(poVar14,";\n");
      }
    }
    for (pVVar15 = (this->m_progSpec).m_varyings.
                   super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pVVar15 !=
        (this->m_progSpec).m_varyings.
        super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
        ._M_impl.super__Vector_impl_data._M_finish; pVVar15 = pVVar15 + 1) {
      if ((ulong)pVVar15->interpolation < 3) {
        pcVar24 = &DAT_009bba18 + *(int *)(&DAT_009bba18 + (ulong)pVVar15->interpolation * 4);
      }
      else {
        pcVar24 = (char *)0x0;
      }
      poVar14 = std::operator<<((ostream *)str,pcVar24);
      poVar14 = std::operator<<(poVar14," ");
      poVar14 = std::operator<<(poVar14,pcVar27);
      name_ = (string *)std::operator<<(poVar14," ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vecIter,(pVVar15->name)._M_dataplus._M_p,(allocator<char> *)&attribName)
      ;
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&vecIter_1,&pVVar15->type,(string *)&vecIter,0);
      poVar14 = glu::decl::operator<<((ostream *)name_,(DeclareVariable *)&vecIter_1);
      std::operator<<(poVar14,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&vecIter_1);
      std::__cxx11::string::~string((string *)&vecIter);
    }
  }
  poVar14 = std::operator<<((ostream *)&vtx,"\nvoid main (void)\n{\n");
  std::operator<<(poVar14,"\tgl_Position = a_position;\n");
  poVar14 = std::operator<<((ostream *)&frag,"\nvoid main (void)\n{\n");
  std::operator<<(poVar14,"\thighp vec4 res = vec4(0.0);\n");
  pTVar20 = (TypeComponentVector *)(CONCAT71((int7)((ulong)name_ >> 8),bVar6) & 0xffffffff ^ 1);
  if ((dVar9 != 0 & (byte)pTVar20) == 0) {
    pcVar27 = "\tgl_PointSize = 1.0;\n";
    if (bVar6) {
      pcVar27 = "\tgl_PointSize = a_pointSize;\n";
    }
    std::operator<<((ostream *)&vtx,pcVar27);
  }
  for (pVVar15 = (this->m_progSpec).m_varyings.
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar15 !=
      (this->m_progSpec).m_varyings.
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
      ._M_impl.super__Vector_impl_data._M_finish; pVVar15 = pVVar15 + 1) {
    this_03 = (TransformFeedback *)(pVVar15->name)._M_dataplus._M_p;
    glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator(&vecIter_1,&pVVar15->type);
    while( true ) {
      vecIter.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecIter.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecIter.m_type = (VarType *)0x0;
      vecIter.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bVar6 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                        (&vecIter_1,(SubTypeIterator<glu::IsVectorOrScalarType> *)&vecIter);
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base(&vecIter.m_path.
                     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                   );
      if (!bVar6) break;
      glu::getVarType(&subType,&pVVar15->type,&vecIter_1.m_path);
      getAttributeName_abi_cxx11_((string *)&vecIter,this_03,(char *)&vecIter_1.m_path,pTVar20);
      poVar14 = std::operator<<((ostream *)&vtx,"\t");
      poVar14 = std::operator<<(poVar14,(char *)this_03);
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::toStream(&vecIter_1,poVar14);
      poVar14 = std::operator<<(poVar14," = ");
      poVar14 = std::operator<<(poVar14,(string *)&vecIter);
      std::operator<<(poVar14,";\n");
      iVar8 = glu::getDataTypeScalarSize(subType.m_data.basic.type);
      std::operator<<((ostream *)&frag,"\tres += ");
      puVar21 = &switchD_0059bb3b::switchdataD_009bb8d0;
      switch(iVar8) {
      case 1:
        poVar14 = std::operator<<((ostream *)&frag,"vec4(");
        poVar14 = std::operator<<(poVar14,(char *)this_03);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::toStream(&vecIter_1,poVar14);
        pcVar27 = ")";
        pTVar20 = (TypeComponentVector *)puVar21;
        break;
      case 2:
        poVar14 = std::operator<<((ostream *)&frag,"vec2(");
        poVar14 = std::operator<<(poVar14,(char *)this_03);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::toStream(&vecIter_1,poVar14);
        pcVar27 = ").xxyy";
        pTVar20 = (TypeComponentVector *)puVar21;
        break;
      case 3:
        poVar14 = std::operator<<((ostream *)&frag,"vec3(");
        poVar14 = std::operator<<(poVar14,(char *)this_03);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::toStream(&vecIter_1,poVar14);
        pcVar27 = ").xyzx";
        pTVar20 = (TypeComponentVector *)puVar21;
        break;
      case 4:
        poVar14 = std::operator<<((ostream *)&frag,"vec4(");
        poVar14 = std::operator<<(poVar14,(char *)this_03);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::toStream(&vecIter_1,poVar14);
        pcVar27 = ")";
        pTVar20 = (TypeComponentVector *)puVar21;
        break;
      default:
        goto switchD_0059bb3b_default;
      }
      std::operator<<(poVar14,pcVar27);
switchD_0059bb3b_default:
      std::operator<<((ostream *)&frag,";\n");
      std::__cxx11::string::~string((string *)&vecIter);
      glu::VarType::~VarType(&subType);
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)&attribName,&vecIter_1,0);
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                    &attribName._M_string_length);
    }
    std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::~_Vector_base
              (&vecIter_1.m_path.
                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>);
  }
  std::operator<<((ostream *)&frag,"\to_color = res * u_scale + u_bias;\n");
  std::operator<<((ostream *)&vtx,"}\n");
  std::operator<<((ostream *)&frag,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&vertSource,(string *)&vecIter_1);
  std::__cxx11::string::~string((string *)&vecIter_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&fragSource,(string *)&vecIter_1);
  std::__cxx11::string::~string((string *)&vecIter_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  pSVar16 = (ShaderProgram *)operator_new(0xd0);
  memset(&vtx,0,0xac);
  local_278 = (pointer)0x0;
  uStack_270 = 0;
  uStack_26f = 0;
  uStack_268 = 0;
  uStack_267 = 0;
  glu::VertexSource::VertexSource((VertexSource *)&frag,&vertSource);
  pPVar17 = glu::ProgramSources::operator<<((ProgramSources *)&vtx,(ShaderSource *)&frag);
  glu::FragmentSource::FragmentSource((FragmentSource *)&vecIter_1,&fragSource);
  pPVar17 = glu::ProgramSources::operator<<(pPVar17,(ShaderSource *)&vecIter_1);
  vecIter.m_type =
       (VarType *)
       (this->m_progSpec).m_transformFeedbackVaryings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  vecIter.m_path.super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_progSpec).m_transformFeedbackVaryings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  pPVar17 = glu::ProgramSources::operator<<
                      (pPVar17,(TransformFeedbackVaryings<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&vecIter);
  pPVar17->transformFeedbackBufferMode = dVar11;
  glu::ShaderProgram::ShaderProgram(pSVar16,renderCtx,pPVar17);
  std::__cxx11::string::~string((string *)&vecIter_1.m_path);
  std::__cxx11::string::~string((string *)auStack_1a0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&vtx);
  std::__cxx11::string::~string((string *)&fragSource);
  std::__cxx11::string::~string((string *)&vertSource);
  this->m_program = pSVar16;
  glu::operator<<((TestLog *)pbVar1,pSVar16);
  pSVar16 = this->m_program;
  if ((pSVar16->m_program).m_info.linkOk != false) {
    _vtx = (pointer)pbVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
    std::operator<<((ostream *)auStack_320,"Transform feedback varyings: ");
    _frag = (this->m_progSpec).m_transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    auStack_1a0._0_8_ =
         (this->m_progSpec).m_transformFeedbackVaryings.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    tcu::Format::operator<<
              ((ostream *)auStack_320,
               (Array<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&frag);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
    _vtx = (pointer)pbVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
    std::operator<<((ostream *)auStack_320,"Transform feedback varyings reported by compiler:");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
    dVar11 = (this->m_program->m_program).m_program;
    maxTfInterleavedComponents = 0;
    vertSource._M_dataplus._M_p = vertSource._M_dataplus._M_p & 0xffffffff00000000;
    (**(code **)(lVar13 + 0x9d8))(dVar11,0x8c83);
    (**(code **)(lVar13 + 0x9d8))(dVar11,0x8c76,&vertSource);
    dVar9 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar9,"Query TF varyings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x338);
    _vtx = (pointer)pbVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
    std::operator<<((ostream *)auStack_320,"GL_TRANSFORM_FEEDBACK_VARYINGS = ");
    std::ostream::operator<<((ostringstream *)auStack_320,maxTfInterleavedComponents);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&attribName,
               (long)((int)vertSource._M_dataplus._M_p + 1),(allocator_type *)&vtx);
    for (iVar8 = 0; iVar8 < maxTfInterleavedComponents; iVar8 = iVar8 + 1) {
      fragSource._M_dataplus._M_p = fragSource._M_dataplus._M_p & 0xffffffff00000000;
      attribType.m_type = TYPE_BASIC;
      (**(code **)(lVar13 + 0xb18))
                (dVar11,iVar8,
                 (DataType)attribName._M_string_length - (int)attribName._M_dataplus._M_p,0,
                 &fragSource,&attribType,attribName._M_dataplus._M_p);
      dVar9 = (**(code **)(lVar13 + 0x800))();
      glu::checkError(dVar9,"glGetTransformFeedbackVarying()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x344);
      dataType = glu::getDataTypeFromGLType(attribType.m_type);
      if (dataType == TYPE_LAST) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vecIter_1,"unknown(",(allocator<char> *)&attrib);
        subType._0_8_ = ZEXT48(attribType.m_type);
        tcu::Format::Hex<8ul>::toString_abi_cxx11_((string *)&vecIter,&subType);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vecIter_1,(string *)&vecIter);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,")"
                      );
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&vecIter);
        std::__cxx11::string::~string((string *)&vecIter_1);
      }
      else {
        pcVar27 = glu::getDataTypeName(dataType);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&frag,pcVar27,(allocator<char> *)&vtx);
      }
      _vtx = (pointer)pbVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_320);
      std::operator<<((ostream *)auStack_320,attribName._M_dataplus._M_p);
      std::operator<<((ostream *)auStack_320,": ");
      std::operator<<((ostream *)auStack_320,(string *)&frag);
      std::operator<<((ostream *)auStack_320,"[");
      std::ostream::operator<<((ostringstream *)auStack_320,(int)fragSource._M_dataplus._M_p);
      std::operator<<((ostream *)auStack_320,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vtx,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_320);
      std::__cxx11::string::~string((string *)&frag);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&attribName);
    bVar6 = ProgramSpec::isPointSizeUsed(this_00);
    this->m_inputStride = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&frag,"a_position",(allocator<char> *)&vecIter);
    glu::VarType::VarType((VarType *)&vecIter_1,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    path_00 = (TransformFeedbackCase *)(ulong)(uint)this->m_inputStride;
    Attribute::Attribute
              ((Attribute *)&vtx,(string *)&frag,(VarType *)&vecIter_1,this->m_inputStride);
    this_01 = &this->m_attributes;
    std::
    vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
    ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>(this_01,(Attribute *)&vtx)
    ;
    Attribute::~Attribute((Attribute *)&vtx);
    glu::VarType::~VarType((VarType *)&vecIter_1);
    std::__cxx11::string::~string((string *)&frag);
    this->m_inputStride = this->m_inputStride + 0x10;
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frag,"a_pointSize",(allocator<char> *)&vecIter);
      glu::VarType::VarType((VarType *)&vecIter_1,TYPE_FLOAT,PRECISION_HIGHP);
      path_00 = (TransformFeedbackCase *)(ulong)(uint)this->m_inputStride;
      Attribute::Attribute
                ((Attribute *)&vtx,(string *)&frag,(VarType *)&vecIter_1,this->m_inputStride);
      std::
      vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
                (this_01,(Attribute *)&vtx);
      Attribute::~Attribute((Attribute *)&vtx);
      glu::VarType::~VarType((VarType *)&vecIter_1);
      std::__cxx11::string::~string((string *)&frag);
      this->m_inputStride = this->m_inputStride + 4;
    }
    for (pVVar15 = (this->m_progSpec).m_varyings.
                   super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pVVar15 !=
        (this->m_progSpec).m_varyings.
        super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
        ._M_impl.super__Vector_impl_data._M_finish; pVVar15 = pVVar15 + 1) {
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)&frag,&pVVar15->type);
      while( true ) {
        auStack_320._8_8_ = (pointer)0x0;
        auStack_320._16_8_ = (pointer)0x0;
        _vtx = (pointer)0x0;
        auStack_320._0_8_ = (pointer)0x0;
        bVar6 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                          ((SubTypeIterator<glu::IsVectorOrScalarType> *)&frag,
                           (SubTypeIterator<glu::IsVectorOrScalarType> *)&vtx);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )auStack_320);
        if (!bVar6) break;
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::getType
                  ((VarType *)&attribName,(SubTypeIterator<glu::IsVectorOrScalarType> *)&frag);
        getAttributeName_abi_cxx11_
                  ((string *)&vecIter_1,(TransformFeedback *)(pVVar15->name)._M_dataplus._M_p,
                   auStack_1a0,(TypeComponentVector *)path_00);
        Attribute::Attribute
                  ((Attribute *)&vtx,(string *)&vecIter_1,(VarType *)&attribName,this->m_inputStride
                  );
        std::
        vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
        ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
                  (this_01,(Attribute *)&vtx);
        Attribute::~Attribute((Attribute *)&vtx);
        iVar8 = glu::getDataTypeScalarSize((DataType)attribName._M_string_length);
        this->m_inputStride = this->m_inputStride + iVar8 * 4;
        path_00 = this;
        std::__cxx11::string::~string((string *)&vecIter_1);
        glu::VarType::~VarType((VarType *)&attribName);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                  (&vecIter,(SubTypeIterator<glu::IsVectorOrScalarType> *)&frag,0);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base(&vecIter.m_path.
                       super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                     );
      }
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                    auStack_1a0);
    }
    dVar11 = this->m_bufferMode;
    std::
    vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
    ::resize(&this->m_transformFeedbackOutputs,
             (long)(this->m_progSpec).m_transformFeedbackVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_progSpec).m_transformFeedbackVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
    pTVar20 = (TypeComponentVector *)0x0;
    iVar8 = 0;
    do {
      pbVar1 = (this->m_progSpec).m_transformFeedbackVaryings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)(int)((ulong)((long)(this->m_progSpec).m_transformFeedbackVaryings.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5)
          <= (long)pTVar20) {
        if (this->m_bufferMode == 0x8c8d) {
          for (pOVar22 = (this->m_transformFeedbackOutputs).
                         super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pOVar22 !=
              (this->m_transformFeedbackOutputs).
              super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
              ._M_impl.super__Vector_impl_data._M_finish; pOVar22 = pOVar22 + 1) {
            iVar8 = glu::VarType::getScalarSize(&pOVar22->type);
            _vtx = iVar8 << 2;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&this->m_bufferStrides,(int *)&vtx);
          }
        }
        else {
          _vtx = _vtx & 0xffffffff00000000;
          for (pOVar22 = (this->m_transformFeedbackOutputs).
                         super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pOVar22 !=
              (this->m_transformFeedbackOutputs).
              super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
              ._M_impl.super__Vector_impl_data._M_finish; pOVar22 = pOVar22 + 1) {
            iVar8 = glu::VarType::getScalarSize(&pOVar22->type);
            _vtx = _vtx + iVar8 * 4;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->m_bufferStrides,(value_type_conflict1 *)&vtx);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&this->m_outputBuffers,
                   (long)(this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2);
        (**(code **)(lVar13 + 0x6c8))
                  ((ulong)((long)(this->m_outputBuffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_outputBuffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
        this_04 = (TypedObjectWrapper<(glu::ObjectType)4> *)operator_new(0x18);
        glu::TypedObjectWrapper<(glu::ObjectType)4>::TypedObjectWrapper
                  (this_04,((this->super_TestCase).m_context)->m_renderCtx);
        this->m_transformFeedback = this_04;
        dVar11 = (**(code **)(lVar13 + 0x800))();
        glu::checkError(dVar11,"init",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                        ,0x3d4);
        this->m_iterNdx = 0;
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        return extraout_EAX;
      }
      pbVar23 = pbVar1 + (long)pTVar20;
      iVar10 = 0;
      iVar12 = iVar8;
      if (dVar11 == 0x8c8d) {
        iVar10 = (int)pTVar20;
        iVar12 = 0;
      }
      pOVar3 = (this->m_transformFeedbackOutputs).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pOVar22 = pOVar3 + (long)pTVar20;
      path_01 = pTVar20;
      std::__cxx11::string::_M_assign((string *)pOVar22);
      pOVar3[(long)pTVar20].bufferNdx = iVar10;
      pOVar3[(long)pTVar20].offset = iVar12;
      bVar6 = std::operator==(pbVar23,"gl_Position");
      if (bVar6) {
        _Var18._M_current =
             (this->m_attributes).
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
        _Var4._M_current =
             (this->m_attributes).
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&frag,"a_position",(allocator<char> *)&subType);
        this_06 = (VectorTypeIterator *)&vtx;
        std::__cxx11::string::string((string *)this_06,(string *)&frag);
        _Var18 = std::
                 find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                           (_Var18,_Var4,(AttributeNameEquals *)this_06);
LAB_0059c595:
        std::__cxx11::string::~string((string *)this_06);
        std::__cxx11::string::~string((string *)&frag);
        attribName._M_dataplus._M_p = (pointer)_Var18._M_current;
        glu::VarType::operator=(&pOVar22->type,&(_Var18._M_current)->type);
        std::
        vector<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
        ::push_back(&pOVar22->inputs,(value_type *)&attribName);
      }
      else {
        bVar6 = std::operator==(pbVar23,"gl_PointSize");
        if (bVar6) {
          _Var18._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Var4._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&frag,"a_pointSize",(allocator<char> *)&subType);
          this_06 = &vecIter_1;
          std::__cxx11::string::string((string *)this_06,(string *)&frag);
          _Var18 = std::
                   find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                             (_Var18,_Var4,(AttributeNameEquals *)this_06);
          goto LAB_0059c595;
        }
        glu::parseVariableName_abi_cxx11_
                  ((string *)&frag,(glu *)(pbVar23->_M_dataplus)._M_p,nameWithPath);
        _Var19._M_current =
             (this->m_progSpec).m_varyings.
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
             ._M_impl.super__Vector_impl_data._M_start;
        _Var5._M_current =
             (this->m_progSpec).m_varyings.
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::string((string *)&vecIter,(string *)&frag);
        _Var19 = std::
                 find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Varying_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Varying,std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>>>,deqp::gles3::Functional::TransformFeedback::VaryingNameEquals>
                           (_Var19,_Var5,(VaryingNameEquals *)&vecIter);
        std::__cxx11::string::~string((string *)&vecIter);
        fragSource.field_2._M_allocated_capacity = 0;
        fragSource._M_dataplus._M_p = (pointer)0x0;
        fragSource._M_string_length = 0;
        glu::parseTypePath((pbVar23->_M_dataplus)._M_p,&(_Var19._M_current)->type,
                           (TypeComponentVector *)&fragSource);
        glu::getVarType((VarType *)&attribName,&(_Var19._M_current)->type,
                        (TypeComponentVector *)&fragSource);
        glu::VarType::operator=(&pOVar22->type,(VarType *)&attribName);
        glu::VarType::~VarType((VarType *)&attribName);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                  ((SubTypeIterator<glu::IsVectorOrScalarType> *)&attribName,&pOVar22->type);
        while( true ) {
          subType.m_data._8_8_ = 0;
          subType.m_type = TYPE_BASIC;
          subType._4_4_ = 0;
          subType.m_data.array.elementType = (VarType *)0x0;
          bVar6 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                            ((SubTypeIterator<glu::IsVectorOrScalarType> *)&attribName,
                             (SubTypeIterator<glu::IsVectorOrScalarType> *)&subType);
          std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                         *)&subType.m_data.basic);
          if (!bVar6) break;
          std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::vector
                    ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                     &attribType,
                     ((long)(attribName.field_2._M_allocated_capacity -
                            CONCAT44(attribName._M_string_length._4_4_,
                                     (DataType)attribName._M_string_length)) >> 3) +
                     ((long)(fragSource._M_string_length - (long)fragSource._M_dataplus._M_p) >> 3),
                     (allocator_type *)&subType);
          if (fragSource._M_string_length - (long)fragSource._M_dataplus._M_p != 0) {
            memmove((void *)CONCAT44(attribType._4_4_,attribType.m_type),fragSource._M_dataplus._M_p
                    ,fragSource._M_string_length - (long)fragSource._M_dataplus._M_p);
          }
          __n = attribName.field_2._M_allocated_capacity -
                (long)CONCAT44(attribName._M_string_length._4_4_,
                               (DataType)attribName._M_string_length);
          if (__n != 0) {
            memmove((void *)((fragSource._M_string_length - (long)fragSource._M_dataplus._M_p) +
                            CONCAT44(attribType._4_4_,attribType.m_type)),
                    (void *)CONCAT44(attribName._M_string_length._4_4_,
                                     (DataType)attribName._M_string_length),__n);
          }
          getAttributeName_abi_cxx11_
                    ((string *)&subType,(TransformFeedback *)_frag,(char *)&attribType,path_01);
          _Var18._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Var4._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::string((string *)&maxTfInterleavedComponents,(string *)&subType);
          _Var18 = std::
                   find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                             (_Var18,_Var4,(AttributeNameEquals *)&maxTfInterleavedComponents);
          std::__cxx11::string::~string((string *)&maxTfInterleavedComponents);
          attrib = _Var18._M_current;
          std::
          vector<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
          ::push_back(&pOVar22->inputs,&attrib);
          std::__cxx11::string::~string((string *)&subType);
          std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                         *)&attribType);
          glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                    ((SubTypeIterator<glu::IsVectorOrScalarType> *)&vertSource,
                     (SubTypeIterator<glu::IsVectorOrScalarType> *)&attribName,0);
          std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                         *)&vertSource._M_string_length);
        }
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )&attribName._M_string_length);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )&fragSource);
        std::__cxx11::string::~string((string *)&frag);
      }
      iVar10 = glu::VarType::getScalarSize(&pOVar22->type);
      iVar8 = iVar8 + iVar10 * 4;
      pTVar20 = (TypeComponentVector *)
                ((long)&(pTVar20->
                        super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    } while( true );
  }
  if ((((*pSVar16->m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true) &&
     (((*pSVar16->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true)) {
    dVar11 = this->m_bufferMode;
    subType._0_8_ = subType._0_8_ & 0xffffffff00000000;
    maxTfInterleavedComponents = 0;
    vertSource._M_dataplus._M_p = vertSource._M_dataplus._M_p & 0xffffffff00000000;
    fragSource._M_dataplus._M_p = fragSource._M_dataplus._M_p & 0xffffffff00000000;
    (**(code **)(lVar13 + 0x868))(0x8869);
    (**(code **)(lVar13 + 0x868))(0x8c8a,&maxTfInterleavedComponents);
    (**(code **)(lVar13 + 0x868))(0x8c8b,&vertSource);
    (**(code **)(lVar13 + 0x868))(0x8c80,&fragSource);
    bVar6 = ProgramSpec::isPointSizeUsed(this_00);
    iVar8 = bVar6 + 1;
    pcVar27 = extraout_RDX;
    for (pVVar15 = (this->m_progSpec).m_varyings.
                   super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pVVar15 !=
        (this->m_progSpec).m_varyings.
        super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
        ._M_impl.super__Vector_impl_data._M_finish; pVVar15 = pVVar15 + 1) {
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)&vtx,&pVVar15->type);
      while( true ) {
        auStack_1a0._8_8_ = 0;
        aaStack_190[0]._M_allocated_capacity = 0;
        _frag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        auStack_1a0._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
        ;
        bVar6 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                          ((SubTypeIterator<glu::IsVectorOrScalarType> *)&vtx,
                           (SubTypeIterator<glu::IsVectorOrScalarType> *)&frag);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )auStack_1a0);
        if (!bVar6) break;
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                  (&vecIter_1,(SubTypeIterator<glu::IsVectorOrScalarType> *)&vtx,0);
        iVar8 = iVar8 + 1;
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base(&vecIter_1.m_path.
                       super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                     );
      }
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                    auStack_320);
      pcVar27 = extraout_RDX_00;
    }
    if (iVar8 <= (int)subType.m_type) {
      iVar10 = 0;
      iVar8 = 0;
      for (pbVar23 = (this->m_progSpec).m_transformFeedbackVaryings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar23 !=
          (this->m_progSpec).m_transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar23 = pbVar23 + 1) {
        bVar6 = std::operator==(pbVar23,"gl_Position");
        pcVar27 = extraout_RDX_01;
        iVar12 = 4;
        if (!bVar6) {
          bVar6 = std::operator==(pbVar23,"gl_PointSize");
          iVar12 = 1;
          pcVar27 = nameWithPath_00;
          if (!bVar6) {
            glu::parseVariableName_abi_cxx11_
                      ((string *)&vtx,(glu *)(pbVar23->_M_dataplus)._M_p,nameWithPath_00);
            _Var19._M_current =
                 (this->m_progSpec).m_varyings.
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var5._M_current =
                 (this->m_progSpec).m_varyings.
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::string((string *)&vecIter,(string *)&vtx);
            _Var19 = std::
                     find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Varying_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Varying,std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>>>,deqp::gles3::Functional::TransformFeedback::VaryingNameEquals>
                               (_Var19,_Var5,(VaryingNameEquals *)&vecIter);
            std::__cxx11::string::~string((string *)&vecIter);
            auStack_1a0._8_8_ = 0;
            _frag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            auStack_1a0._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            glu::parseTypePath((pbVar23->_M_dataplus)._M_p,&(_Var19._M_current)->type,
                               (TypeComponentVector *)&frag);
            glu::getVarType((VarType *)&attribName,&(_Var19._M_current)->type,
                            (TypeComponentVector *)&frag);
            iVar12 = glu::VarType::getScalarSize((VarType *)&attribName);
            glu::VarType::~VarType((VarType *)&attribName);
            std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
            ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                           *)&frag);
            std::__cxx11::string::~string((string *)&vtx);
            pcVar27 = extraout_RDX_02;
          }
        }
        if ((dVar11 == 0x8c8d) && ((int)fragSource._M_dataplus._M_p < iVar12)) goto LAB_0059cb38;
        iVar8 = iVar8 + 1;
        iVar10 = iVar10 + iVar12;
      }
      if (((dVar11 != 0x8c8d) || (iVar8 <= (int)vertSource._M_dataplus._M_p)) &&
         ((dVar11 != 0x8c8c || (iVar10 <= maxTfInterleavedComponents)))) {
        for (pbVar26 = (this->m_progSpec).m_transformFeedbackVaryings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar23;
            pbVar26 = pbVar26 + 1) {
          glu::parseVariableName_abi_cxx11_
                    ((string *)&vtx,(glu *)(pbVar26->_M_dataplus)._M_p,pcVar27);
          _Var19._M_current =
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Var5._M_current =
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::string((string *)&frag,(string *)&vtx);
          _Var19 = std::
                   find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Varying_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Varying,std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>>>,deqp::gles3::Functional::TransformFeedback::VaryingNameEquals>
                             (_Var19,_Var5,(VaryingNameEquals *)&frag);
          std::__cxx11::string::~string((string *)&frag);
          bVar6 = std::operator==((string *)&vtx,"gl_Position");
          if (((!bVar6) && (bVar6 = std::operator==((string *)&vtx,"gl_PointSize"), !bVar6)) &&
             (((_Var19._M_current)->type).m_type == TYPE_ARRAY)) {
            std::__cxx11::string::~string((string *)&vtx);
            this_05 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (this_05,"Capturing arrays is not supported (undefined in specification)","",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                       ,0x3a8);
            goto LAB_0059cb66;
          }
          std::__cxx11::string::~string((string *)&vtx);
          pbVar23 = (this->m_progSpec).m_transformFeedbackVaryings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pcVar27 = extraout_RDX_03;
        }
        this_05 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  ((TestError *)this_05,"Link failed","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                   ,0x3aa);
        goto LAB_0059cb18;
      }
    }
LAB_0059cb38:
    this_05 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_05,"Implementation limits execeeded","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
               ,0x3a6);
LAB_0059cb66:
    ppuVar25 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    this_05 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_05,"Compile failed","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
               ,0x3ad);
LAB_0059cb18:
    ppuVar25 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_05,ppuVar25,tcu::Exception::~Exception);
}

Assistant:

void TransformFeedbackCase::init (void)
{
	TestLog&				log	= m_testCtx.getLog();
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	DE_ASSERT(!m_program);
	m_program = createVertexCaptureProgram(m_context.getRenderContext(), m_progSpec, m_bufferMode, m_primitiveType);

	log << *m_program;
	if (!m_program->isOk())
	{
		const bool linkFail = m_program->getShaderInfo(glu::SHADERTYPE_VERTEX).compileOk &&
							  m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk &&
							  !m_program->getProgramInfo().linkOk;

		if (linkFail)
		{
			if (!isProgramSupported(gl, m_progSpec, m_bufferMode))
				throw tcu::NotSupportedError("Implementation limits execeeded", "", __FILE__, __LINE__);
			else if (hasArraysInTFVaryings(m_progSpec))
				throw tcu::NotSupportedError("Capturing arrays is not supported (undefined in specification)", "", __FILE__, __LINE__);
			else
				throw tcu::TestError("Link failed", "", __FILE__, __LINE__);
		}
		else
			throw tcu::TestError("Compile failed", "", __FILE__, __LINE__);
	}

	log << TestLog::Message << "Transform feedback varyings: " << tcu::formatArray(m_progSpec.getTransformFeedbackVaryings().begin(), m_progSpec.getTransformFeedbackVaryings().end()) << TestLog::EndMessage;

	// Print out transform feedback points reported by GL.
	log << TestLog::Message << "Transform feedback varyings reported by compiler:" << TestLog::EndMessage;
	logTransformFeedbackVaryings(log, gl, m_program->getProgram());

	// Compute input specification.
	computeInputLayout(m_attributes, m_inputStride, m_progSpec.getVaryings(), m_progSpec.isPointSizeUsed());

	// Build list of varyings used in transform feedback.
	computeTransformFeedbackOutputs(m_transformFeedbackOutputs, m_attributes, m_progSpec.getVaryings(), m_progSpec.getTransformFeedbackVaryings(), m_bufferMode);
	DE_ASSERT(!m_transformFeedbackOutputs.empty());

	// Buffer strides.
	DE_ASSERT(m_bufferStrides.empty());
	if (m_bufferMode == GL_SEPARATE_ATTRIBS)
	{
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			m_bufferStrides.push_back(outIter->type.getScalarSize()*(int)sizeof(deUint32));
	}
	else
	{
		int totalSize = 0;
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			totalSize += outIter->type.getScalarSize()*(int)sizeof(deUint32);

		m_bufferStrides.push_back(totalSize);
	}

	// \note Actual storage is allocated in iterate().
	m_outputBuffers.resize(m_bufferStrides.size());
	gl.genBuffers((glw::GLsizei)m_outputBuffers.size(), &m_outputBuffers[0]);

	DE_ASSERT(!m_transformFeedback);
	m_transformFeedback = new glu::TransformFeedback(m_context.getRenderContext());

	GLU_EXPECT_NO_ERROR(gl.getError(), "init");

	m_iterNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}